

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int us_internal_ssl_socket_write(us_internal_ssl_socket_t *s,char *data,int length,int msg_more)

{
  void *pvVar1;
  int iVar2;
  int ret_code;
  uint uVar3;
  us_socket_context_t *context;
  us_loop_t *puVar4;
  
  iVar2 = us_socket_is_closed(0,&s->s);
  ret_code = 0;
  if (iVar2 == 0) {
    iVar2 = us_internal_ssl_socket_is_shut_down(s);
    ret_code = 0;
    if (iVar2 == 0) {
      context = us_socket_context(0,&s->s);
      puVar4 = us_socket_context_loop(0,context);
      pvVar1 = (puVar4->data).ssl_data;
      *(undefined4 *)((long)pvVar1 + 0x10) = 0;
      *(us_internal_ssl_socket_t **)((long)pvVar1 + 0x18) = s;
      *(int *)((long)pvVar1 + 0x24) = msg_more;
      *(undefined4 *)((long)pvVar1 + 0x20) = 0;
      ret_code = SSL_write((SSL *)s->ssl,data,length);
      *(undefined4 *)((long)pvVar1 + 0x24) = 0;
      if ((msg_more == 0) && (*(int *)((long)pvVar1 + 0x20) != 0)) {
        us_socket_flush(0,&s->s);
      }
      if (ret_code < 1) {
        uVar3 = SSL_get_error((SSL *)s->ssl,ret_code);
        if (uVar3 == 2) {
          s->ssl_write_wants_read = 1;
          ret_code = 0;
        }
        else {
          ret_code = 0;
          if ((uVar3 & 0xfffffffb) == 1) {
            ERR_clear_error();
          }
        }
      }
    }
  }
  return ret_code;
}

Assistant:

int us_internal_ssl_socket_write(struct us_internal_ssl_socket_t *s, const char *data, int length, int msg_more) {
    if (us_socket_is_closed(0, &s->s) || us_internal_ssl_socket_is_shut_down(s)) {
        return 0;
    }

    struct us_internal_ssl_socket_context_t *context = (struct us_internal_ssl_socket_context_t *) us_socket_context(0, &s->s);

    struct us_loop_t *loop = us_socket_context_loop(0, &context->sc);
    struct loop_ssl_data *loop_ssl_data = (struct loop_ssl_data *) loop->data.ssl_data;

    // it makes literally no sense to touch this here! it should start at 0 and ONLY be set and reset by the on_data function!
    // the way is is now, triggering a write from a read will essentially delete all input data!
    // what we need to do is to check if this ever is non-zero and print a warning



    loop_ssl_data->ssl_read_input_length = 0;


    loop_ssl_data->ssl_socket = &s->s;
    loop_ssl_data->msg_more = msg_more;
    loop_ssl_data->last_write_was_msg_more = 0;
    //printf("Calling SSL_write\n");
    int written = SSL_write(s->ssl, data, length);
    //printf("Returning from SSL_write\n");
    loop_ssl_data->msg_more = 0;

    if (loop_ssl_data->last_write_was_msg_more && !msg_more) {
        us_socket_flush(0, &s->s);
    }

    if (written > 0) {
        return written;
    } else {
        int err = SSL_get_error(s->ssl, written);
        if (err == SSL_ERROR_WANT_READ) {
            // here we need to trigger writable event next ssl_read!
            s->ssl_write_wants_read = 1;
        } else if (err == SSL_ERROR_SSL || err == SSL_ERROR_SYSCALL) {
            // these two errors may add to the error queue, which is per thread and must be cleared
            ERR_clear_error();

            // all errors here except for want write are critical and should not happen
        }

        return 0;
    }
}